

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# addrdb.cpp
# Opt level: O0

bool (anonymous_namespace)::
     SerializeFileDB<ParamsWrapper<CAddress::SerParams,std::vector<CAddress,std::allocator<CAddress>>const>>
               (string *prefix,path *path,
               ParamsWrapper<CAddress::SerParams,_const_std::vector<CAddress,_std::allocator<CAddress>_>_>
               *data)

{
  string_view source_file;
  string_view source_file_00;
  string_view source_file_01;
  bool bVar1;
  unsigned_short uVar2;
  FILE *__stream;
  FILE *in_RDX;
  ConstevalFormatString<2U> in_RDI;
  long in_FS_OFFSET;
  FILE *file;
  uint16_t randv;
  AutoFile fileout;
  path pathTmp;
  string tmpfn;
  undefined4 in_stack_fffffffffffffcd8;
  undefined4 in_stack_fffffffffffffcdc;
  ArgsManager *in_stack_fffffffffffffce0;
  FastRandomContext *in_stack_fffffffffffffce8;
  path *in_stack_fffffffffffffcf0;
  basic_string_view<char,_std::char_traits<char>_> *in_stack_fffffffffffffcf8;
  unsigned_short *in_stack_fffffffffffffd08;
  undefined4 in_stack_fffffffffffffd10;
  undefined1 in_stack_fffffffffffffd14;
  undefined1 in_stack_fffffffffffffd15;
  undefined1 in_stack_fffffffffffffd16;
  undefined1 in_stack_fffffffffffffd17;
  char *in_stack_fffffffffffffd18;
  AutoFile *this;
  ParamsWrapper<CAddress::SerParams,_const_std::vector<CAddress,_std::allocator<CAddress>_>_>
  *in_stack_fffffffffffffd40;
  AutoFile *in_stack_fffffffffffffd48;
  int iVar3;
  undefined7 in_stack_fffffffffffffd90;
  undefined1 in_stack_fffffffffffffd97;
  byte bVar4;
  char *in_stack_fffffffffffffd98;
  string_view in_stack_fffffffffffffda0;
  undefined1 local_208 [136];
  Level in_stack_fffffffffffffe80;
  char (*in_stack_fffffffffffffe90) [16];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffe98;
  path local_d8 [5];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  FastRandomContext::FastRandomContext
            (in_stack_fffffffffffffce8,SUB81((ulong)in_stack_fffffffffffffce0 >> 0x38,0));
  uVar2 = RandomMixin<FastRandomContext>::rand<unsigned_short>
                    ((RandomMixin<FastRandomContext> *)
                     CONCAT44(in_stack_fffffffffffffcdc,in_stack_fffffffffffffcd8));
  FastRandomContext::~FastRandomContext
            ((FastRandomContext *)CONCAT44(in_stack_fffffffffffffcdc,in_stack_fffffffffffffcd8));
  local_208._30_2_ = uVar2;
  tinyformat::format<std::__cxx11::string,unsigned_short>
            (in_stack_fffffffffffffd18,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_fffffffffffffd17,
                      CONCAT16(in_stack_fffffffffffffd16,
                               CONCAT15(in_stack_fffffffffffffd15,
                                        CONCAT14(in_stack_fffffffffffffd14,in_stack_fffffffffffffd10
                                                )))),in_stack_fffffffffffffd08);
  ArgsManager::GetDataDirNet(in_stack_fffffffffffffce0);
  fs::u8path((string *)
             CONCAT17(in_stack_fffffffffffffd17,
                      CONCAT16(in_stack_fffffffffffffd16,
                               CONCAT15(in_stack_fffffffffffffd15,
                                        CONCAT14(in_stack_fffffffffffffd14,in_stack_fffffffffffffd10
                                                )))));
  fs::operator/(in_stack_fffffffffffffcf0,(path *)in_stack_fffffffffffffce8);
  fs::path::~path((path *)CONCAT44(in_stack_fffffffffffffcdc,in_stack_fffffffffffffcd8));
  fs::path::~path((path *)CONCAT44(in_stack_fffffffffffffcdc,in_stack_fffffffffffffcd8));
  __stream = fsbridge::fopen((char *)local_d8,"wb");
  local_208._0_8_ = (FILE *)0x0;
  local_208._8_8_ = (pointer)0x0;
  local_208._16_8_ = (pointer)0x0;
  this = (AutoFile *)local_208;
  std::vector<std::byte,_std::allocator<std::byte>_>::vector
            ((vector<std::byte,_std::allocator<std::byte>_> *)
             CONCAT44(in_stack_fffffffffffffcdc,in_stack_fffffffffffffcd8));
  AutoFile::AutoFile(this,(FILE *)__stream,
                     (vector<std::byte,_std::allocator<std::byte>_> *)
                     CONCAT17(in_stack_fffffffffffffd17,
                              CONCAT16(in_stack_fffffffffffffd16,
                                       CONCAT15(in_stack_fffffffffffffd15,
                                                CONCAT14(in_stack_fffffffffffffd14,
                                                         in_stack_fffffffffffffd10)))));
  std::vector<std::byte,_std::allocator<std::byte>_>::~vector
            ((vector<std::byte,_std::allocator<std::byte>_> *)in_stack_fffffffffffffce8);
  bVar1 = AutoFile::IsNull((AutoFile *)CONCAT44(in_stack_fffffffffffffcdc,in_stack_fffffffffffffcd8)
                          );
  if (bVar1) {
    AutoFile::fclose((AutoFile *)(local_208 + 0x20),__stream);
    iVar3 = (int)((ulong)in_stack_fffffffffffffd48 >> 0x20);
    std::filesystem::remove(local_d8);
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              (in_stack_fffffffffffffcf8,(char *)in_stack_fffffffffffffcf0);
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              (in_stack_fffffffffffffcf8,(char *)in_stack_fffffffffffffcf0);
    fs::PathToString_abi_cxx11_((path *)in_stack_fffffffffffffce0);
    in_stack_fffffffffffffcd8 = 4;
    source_file._M_len._7_1_ = in_stack_fffffffffffffd97;
    source_file._M_len._0_7_ = in_stack_fffffffffffffd90;
    source_file._M_str = in_stack_fffffffffffffd98;
    LogPrintFormatInternal<char[16],std::__cxx11::string>
              (in_stack_fffffffffffffda0,source_file,iVar3,(LogFlags)in_stack_fffffffffffffd40,
               in_stack_fffffffffffffe80,in_RDI,in_stack_fffffffffffffe90,in_stack_fffffffffffffe98)
    ;
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               CONCAT44(in_stack_fffffffffffffcdc,in_stack_fffffffffffffcd8));
    bVar4 = 0;
  }
  else {
    bVar1 = SerializeDB<AutoFile,ParamsWrapper<CAddress::SerParams,std::vector<CAddress,std::allocator<CAddress>>const>>
                      (in_stack_fffffffffffffd48,in_stack_fffffffffffffd40);
    iVar3 = (int)((ulong)in_stack_fffffffffffffd48 >> 0x20);
    if (bVar1) {
      bVar1 = AutoFile::Commit((AutoFile *)
                               CONCAT44(in_stack_fffffffffffffcdc,in_stack_fffffffffffffcd8));
      if (bVar1) {
        AutoFile::fclose((AutoFile *)(local_208 + 0x20),in_RDX);
        fs::path::path((path *)CONCAT44(in_stack_fffffffffffffcdc,in_stack_fffffffffffffcd8),
                       (path *)0xed4b17);
        fs::path::path((path *)CONCAT44(in_stack_fffffffffffffcdc,in_stack_fffffffffffffcd8),
                       (path *)0xed4b2e);
        bVar1 = RenameOver((path *)in_stack_fffffffffffffcf8,in_stack_fffffffffffffcf0);
        bVar4 = bVar1 ^ 0xff;
        fs::path::~path((path *)CONCAT44(in_stack_fffffffffffffcdc,in_stack_fffffffffffffcd8));
        fs::path::~path((path *)CONCAT44(in_stack_fffffffffffffcdc,in_stack_fffffffffffffcd8));
        if ((bVar4 & 1) == 0) {
          bVar4 = 1;
        }
        else {
          std::filesystem::remove(local_d8);
          std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                    (in_stack_fffffffffffffcf8,(char *)in_stack_fffffffffffffcf0);
          std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                    (in_stack_fffffffffffffcf8,(char *)in_stack_fffffffffffffcf0);
          in_stack_fffffffffffffcd8 = 4;
          source_file_01._M_len._7_1_ = in_stack_fffffffffffffd97;
          source_file_01._M_len._0_7_ = in_stack_fffffffffffffd90;
          source_file_01._M_str = in_stack_fffffffffffffd98;
          LogPrintFormatInternal<char[16]>
                    (in_stack_fffffffffffffda0,source_file_01,iVar3,0x1ceda4a,
                     in_stack_fffffffffffffe80,(ConstevalFormatString<1U>)in_RDI.fmt,
                     in_stack_fffffffffffffe90);
          bVar4 = 0;
        }
      }
      else {
        AutoFile::fclose((AutoFile *)(local_208 + 0x20),in_RDX);
        std::filesystem::remove(local_d8);
        std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                  (in_stack_fffffffffffffcf8,(char *)in_stack_fffffffffffffcf0);
        std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                  (in_stack_fffffffffffffcf8,(char *)in_stack_fffffffffffffcf0);
        iVar3 = 0;
        fs::PathToString_abi_cxx11_((path *)in_stack_fffffffffffffce0);
        in_stack_fffffffffffffcd8 = 4;
        source_file_00._M_len._7_1_ = in_stack_fffffffffffffd97;
        source_file_00._M_len._0_7_ = in_stack_fffffffffffffd90;
        source_file_00._M_str = in_stack_fffffffffffffd98;
        LogPrintFormatInternal<char[16],std::__cxx11::string>
                  (in_stack_fffffffffffffda0,source_file_00,iVar3,
                   (LogFlags)in_stack_fffffffffffffd40,in_stack_fffffffffffffe80,in_RDI,
                   in_stack_fffffffffffffe90,in_stack_fffffffffffffe98);
        std::__cxx11::string::~string
                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   CONCAT44(in_stack_fffffffffffffcdc,in_stack_fffffffffffffcd8));
        bVar4 = 0;
      }
    }
    else {
      AutoFile::fclose((AutoFile *)(local_208 + 0x20),in_RDX);
      std::filesystem::remove(local_d8);
      bVar4 = 0;
    }
  }
  AutoFile::~AutoFile((AutoFile *)CONCAT44(in_stack_fffffffffffffcdc,in_stack_fffffffffffffcd8));
  fs::path::~path((path *)CONCAT44(in_stack_fffffffffffffcdc,in_stack_fffffffffffffcd8));
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT44(in_stack_fffffffffffffcdc,in_stack_fffffffffffffcd8));
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return (bool)(bVar4 & 1);
  }
  __stack_chk_fail();
}

Assistant:

bool SerializeFileDB(const std::string& prefix, const fs::path& path, const Data& data)
{
    // Generate random temporary filename
    const uint16_t randv{FastRandomContext().rand<uint16_t>()};
    std::string tmpfn = strprintf("%s.%04x", prefix, randv);

    // open temp output file
    fs::path pathTmp = gArgs.GetDataDirNet() / fs::u8path(tmpfn);
    FILE *file = fsbridge::fopen(pathTmp, "wb");
    AutoFile fileout{file};
    if (fileout.IsNull()) {
        fileout.fclose();
        remove(pathTmp);
        LogError("%s: Failed to open file %s\n", __func__, fs::PathToString(pathTmp));
        return false;
    }

    // Serialize
    if (!SerializeDB(fileout, data)) {
        fileout.fclose();
        remove(pathTmp);
        return false;
    }
    if (!fileout.Commit()) {
        fileout.fclose();
        remove(pathTmp);
        LogError("%s: Failed to flush file %s\n", __func__, fs::PathToString(pathTmp));
        return false;
    }
    fileout.fclose();

    // replace existing file, if any, with new file
    if (!RenameOver(pathTmp, path)) {
        remove(pathTmp);
        LogError("%s: Rename-into-place failed\n", __func__);
        return false;
    }

    return true;
}